

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

bool duckdb::NegatePropagateStatistics::Operation<short>
               (LogicalType *type,BaseStatistics *istats,Value *new_min,Value *new_max)

{
  bool bVar1;
  Value *in_RDI;
  int64_t unaff_retaddr;
  LogicalType *in_stack_00000008;
  short min_value;
  short max_value;
  Value *in_stack_ffffffffffffff38;
  short in_stack_ffffffffffffff86;
  BaseStatistics *in_stack_ffffffffffffff90;
  bool local_1;
  
  NumericStats::GetMax<short>(in_stack_ffffffffffffff90);
  NumericStats::GetMin<short>(in_stack_ffffffffffffff90);
  bVar1 = NegateOperator::CanNegate<short>(0);
  if ((bVar1) && (bVar1 = NegateOperator::CanNegate<short>(0), bVar1)) {
    NegateOperator::Operation<short,short>(in_stack_ffffffffffffff86);
    Value::Numeric(in_stack_00000008,unaff_retaddr);
    Value::operator=(in_RDI,in_stack_ffffffffffffff38);
    Value::~Value(in_RDI);
    NegateOperator::Operation<short,short>(in_stack_ffffffffffffff86);
    Value::Numeric(in_stack_00000008,unaff_retaddr);
    Value::operator=(in_RDI,in_stack_ffffffffffffff38);
    Value::~Value(in_RDI);
    local_1 = false;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &istats, Value &new_min, Value &new_max) {
		auto max_value = NumericStats::GetMax<T>(istats);
		auto min_value = NumericStats::GetMin<T>(istats);
		if (!NegateOperator::CanNegate<T>(min_value) || !NegateOperator::CanNegate<T>(max_value)) {
			return true;
		}
		// new min is -max
		new_min = Value::Numeric(type, NegateOperator::Operation<T, T>(max_value));
		// new max is -min
		new_max = Value::Numeric(type, NegateOperator::Operation<T, T>(min_value));
		return false;
	}